

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_tile_sizes(exr_const_context_t ctxt,int part_index,int levelx,int levely,int32_t *tilew,
                  int32_t *tileh)

{
  _internal_exr_part *p_Var1;
  exr_attr_preview_t *peVar2;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  uint *in_R8;
  uint *in_R9;
  int32_t levh;
  int32_t levw;
  exr_attr_tiledesc_t *tiledesc;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if ((p_Var1->storage_mode == EXR_STORAGE_TILED) ||
         (p_Var1->storage_mode == EXR_STORAGE_DEEP_TILED)) {
        if (((p_Var1->tiles == (exr_attribute_t *)0x0) ||
            (((p_Var1->num_tile_levels_x < 1 || (p_Var1->num_tile_levels_y < 1)) ||
             (p_Var1->tile_level_tile_count_x == (int32_t *)0x0)))) ||
           (p_Var1->tile_level_tile_count_y == (int32_t *)0x0)) {
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = (*in_RDI->print_error)(in_RDI,0xd,"Tile data missing or corrupt");
        }
        else if (((in_EDX < 0) || (in_ECX < 0)) ||
                ((p_Var1->num_tile_levels_x <= in_EDX || (p_Var1->num_tile_levels_y <= in_ECX)))) {
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = (*in_RDI->standard_error)(in_RDI,4);
        }
        else {
          peVar2 = (p_Var1->tiles->field_6).preview;
          if (in_R8 != (uint *)0x0) {
            if (peVar2->width < (uint)p_Var1->tile_level_tile_size_x[in_EDX]) {
              *in_R8 = peVar2->width;
            }
            else {
              *in_R8 = p_Var1->tile_level_tile_size_x[in_EDX];
            }
          }
          if (in_R9 != (uint *)0x0) {
            if (peVar2->height < (uint)p_Var1->tile_level_tile_size_y[in_ECX]) {
              *in_R9 = peVar2->height;
            }
            else {
              *in_R9 = p_Var1->tile_level_tile_size_y[in_ECX];
            }
          }
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          local_4 = 0;
        }
      }
      else {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->standard_error)(in_RDI,0x13);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_tile_sizes (
    exr_const_context_t ctxt,
    int                 part_index,
    int                 levelx,
    int                 levely,
    int32_t*            tilew,
    int32_t*            tileh)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* tiledesc;

        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelx < 0 || levely < 0 || levelx >= part->num_tile_levels_x ||
            levely >= part->num_tile_levels_y)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

        tiledesc = part->tiles->tiledesc;
        if (tilew)
        {
            int32_t levw = part->tile_level_tile_size_x[levelx];
            if (tiledesc->x_size < (uint32_t) levw)
                *tilew = (int32_t) tiledesc->x_size;
            else
                *tilew = levw;
        }
        if (tileh)
        {
            int32_t levh = part->tile_level_tile_size_y[levely];
            if (tiledesc->y_size < (uint32_t) levh)
                *tileh = (int32_t) tiledesc->y_size;
            else
                *tileh = levh;
        }
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
        pctxt->standard_error (pctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}